

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfRequestSub.c
# Opt level: O2

void sbfRequestSubSubMessageCb(sbfSub sub0,sbfBuffer buffer,void *closure)

{
  int *piVar1;
  long *plVar2;
  ulong uVar3;
  void *pvVar4;
  long lVar5;
  sbfRequest req;
  long *plVar6;
  long *plVar7;
  sbfPoolItem item;
  long lVar8;
  bool bVar9;
  
  uVar3 = buffer->mSize;
  if (uVar3 < 0x40) {
    return;
  }
  pvVar4 = buffer->mData;
  req = (sbfRequest)sbfMemory_calloc(1,0x68);
  req->mSub = (sbfRequestSub)closure;
  (req->mRefCount).mRefCount = 1;
  sbfGuid_copy(&req->mGuid,pvVar4);
  if (*(long *)((long)closure + 0x18) == 0) goto LAB_00102107;
  if (_gSbfBufferDefaultPool == 0) {
    _gSbfBufferDefaultPool = sbfPool_create1(0x48,"sbfBuffer_wrap",0x58);
    sbfPool_registerAtExit(_gSbfBufferDefaultPool);
  }
  lVar5 = _gSbfBufferDefaultPool;
  LOCK();
  piVar1 = (int *)(*(long *)(_gSbfBufferDefaultPool + 0x28) + 0x18);
  *piVar1 = *piVar1 + 1;
  UNLOCK();
  pthread_spin_lock((pthread_spinlock_t *)(lVar5 + 0x10));
  plVar6 = *(long **)(lVar5 + 0x18);
  if (plVar6 == (long *)0x0) {
    LOCK();
    plVar6 = *(long **)(lVar5 + 0x20);
    *(long *)(lVar5 + 0x20) = 0;
    UNLOCK();
    plVar7 = (long *)0x0;
    if (plVar6 != (long *)0x0) goto LAB_00102038;
  }
  else {
LAB_00102038:
    *(long *)(lVar5 + 0x18) = plVar6[1];
    plVar7 = plVar6;
  }
  lVar8 = (long)pvVar4 + 0x40;
  pthread_spin_unlock((pthread_spinlock_t *)(lVar5 + 0x10));
  if (plVar7 == (long *)0x0) {
    LOCK();
    piVar1 = (int *)(*(long *)(lVar5 + 0x28) + 0x20);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    plVar7 = (long *)sbfMemory_malloc(*(undefined8 *)(lVar5 + 8));
    *plVar7 = lVar5;
    plVar7[1] = 0;
  }
  *(undefined4 *)(plVar7 + 2) = 0;
  plVar6 = plVar7 + 2;
  plVar7[5] = 0;
  plVar7[6] = lVar8;
  plVar7[7] = 0;
  plVar7[3] = lVar8;
  plVar7[4] = uVar3 - 0x40;
  plVar7[8] = 1;
  (**(code **)((long)closure + 0x18))(closure,req,plVar6,*(undefined8 *)((long)closure + 0x20));
  LOCK();
  plVar2 = plVar7 + 8;
  *(int *)plVar2 = (int)*plVar2 + -1;
  UNLOCK();
  if ((int)*plVar2 == 0) {
    if ((code *)plVar7[5] != (code *)0x0) {
      (*(code *)plVar7[5])(plVar6,plVar7[6],plVar7[7]);
    }
    if ((int)*plVar6 == 0) {
      lVar5 = *plVar7;
      LOCK();
      piVar1 = (int *)(*(long *)(lVar5 + 0x28) + 0x1c);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
      do {
        lVar8 = *(long *)(lVar5 + 0x20);
        plVar7[1] = lVar8;
        LOCK();
        bVar9 = lVar8 == *(long *)(lVar5 + 0x20);
        if (bVar9) {
          *(long *)(lVar5 + 0x20) = (long)plVar7;
        }
        UNLOCK();
      } while (!bVar9);
    }
    else {
      free(plVar6);
    }
  }
LAB_00102107:
  sbfRequest_destroy(req);
  return;
}

Assistant:

static void
sbfRequestSubSubMessageCb (sbfSub sub0, sbfBuffer buffer, void* closure)
{
    sbfRequestSub     sub = closure;
    sbfRequestHeader* hdr = sbfBuffer_getData (buffer);
    size_t            size = sbfBuffer_getSize (buffer);
    sbfBuffer         new;
    sbfRequest        req;

    if (size < sizeof *hdr)
        return;

    req = xcalloc (1, sizeof *req);
    req->mSub = sub;
    sbfRefCount_init (&req->mRefCount, 1);

    sbfGuid_copy (&req->mGuid, &hdr->mGuid);

    if (sub->mRequestCb != NULL)
    {
        new = sbfBuffer_wrap (hdr + 1, size - sizeof *hdr, NULL, NULL);
        sub->mRequestCb (sub, req, new, sub->mClosure);
        sbfBuffer_destroy (new);
    }

    sbfRequest_destroy (req);
}